

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O0

vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> * __thiscall
happly::PLYData::getVertexPositions(PLYData *this,string *vertexElementName)

{
  value_type vVar1;
  size_type __n;
  vector<double,_std::allocator<double>_> *pvVar2;
  reference pvVar3;
  reference pvVar4;
  PLYData *in_RDI;
  size_t i;
  vector<double,_std::allocator<double>_> zPos;
  vector<double,_std::allocator<double>_> yPos;
  vector<double,_std::allocator<double>_> xPos;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *result;
  value_type __n_00;
  array<double,_3UL> *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffeb0;
  vector<double,_std::allocator<double>_> *this_00;
  Element *in_stack_fffffffffffffeb8;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *this_01;
  PLYData *this_02;
  vector<double,_std::allocator<double>_> *local_f0;
  undefined1 local_e3 [3];
  string local_e0 [32];
  vector<double,_std::allocator<double>_> local_c0;
  allocator local_a1;
  string local_a0 [32];
  vector<double,_std::allocator<double>_> local_80;
  allocator local_51;
  string local_50 [32];
  vector<double,_std::allocator<double>_> local_30 [2];
  
  this_02 = in_RDI;
  getElement(in_RDI,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"x",&local_51);
  Element::getProperty<double>(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  getElement(this_02,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"y",&local_a1);
  Element::getProperty<double>(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  getElement(this_02,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"z",(allocator *)(local_e3 + 2));
  Element::getProperty<double>(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)(local_e3 + 2));
  local_e3[1] = 0;
  __n = geometrycentral::surface::std::vector<double,_std::allocator<double>_>::size(local_30);
  this_01 = (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)local_e3;
  geometrycentral::surface::std::allocator<std::array<double,_3UL>_>::allocator
            ((allocator<std::array<double,_3UL>_> *)0x2789c2);
  geometrycentral::surface::std::
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
            (this_01,__n,(allocator_type *)in_stack_fffffffffffffeb0);
  geometrycentral::surface::std::allocator<std::array<double,_3UL>_>::~allocator
            ((allocator<std::array<double,_3UL>_> *)0x2789e5);
  local_f0 = (vector<double,_std::allocator<double>_> *)0x0;
  while (this_00 = local_f0,
        pvVar2 = (vector<double,_std::allocator<double>_> *)
                 geometrycentral::surface::std::
                 vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::size
                           ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                             *)in_RDI), this_00 < pvVar2) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_30,(size_type)local_f0);
    __n_00 = *pvVar3;
    geometrycentral::surface::std::
    vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::operator[]
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)in_RDI,
               (size_type)local_f0);
    pvVar4 = geometrycentral::surface::std::array<double,_3UL>::operator[]
                       (in_stack_fffffffffffffea0,(size_type)__n_00);
    *pvVar4 = __n_00;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_80,(size_type)local_f0)
    ;
    in_stack_fffffffffffffea0 = (array<double,_3UL> *)*pvVar3;
    geometrycentral::surface::std::
    vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::operator[]
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)in_RDI,
               (size_type)local_f0);
    pvVar4 = geometrycentral::surface::std::array<double,_3UL>::operator[]
                       (in_stack_fffffffffffffea0,(size_type)__n_00);
    *pvVar4 = (value_type_conflict2)in_stack_fffffffffffffea0;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_c0,(size_type)local_f0)
    ;
    vVar1 = *pvVar3;
    geometrycentral::surface::std::
    vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::operator[]
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)in_RDI,
               (size_type)local_f0);
    pvVar4 = geometrycentral::surface::std::array<double,_3UL>::operator[]
                       (in_stack_fffffffffffffea0,(size_type)__n_00);
    *pvVar4 = vVar1;
    local_f0 = (vector<double,_std::allocator<double>_> *)
               ((long)&(local_f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  local_e3[1] = 1;
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  return (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)this_02;
}

Assistant:

std::vector<std::array<double, 3>> getVertexPositions(const std::string& vertexElementName = "vertex") {

    std::vector<double> xPos = getElement(vertexElementName).getProperty<double>("x");
    std::vector<double> yPos = getElement(vertexElementName).getProperty<double>("y");
    std::vector<double> zPos = getElement(vertexElementName).getProperty<double>("z");

    std::vector<std::array<double, 3>> result(xPos.size());
    for (size_t i = 0; i < result.size(); i++) {
      result[i][0] = xPos[i];
      result[i][1] = yPos[i];
      result[i][2] = zPos[i];
    }

    return result;
  }